

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_setup_directory_location(iso9660_conflict *iso9660,int location,vdd *vdd)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int block;
  int depth;
  isoent *np;
  vdd *vdd_local;
  int location_local;
  iso9660_conflict *iso9660_local;
  
  vdd->total_dir_block = 0;
  local_2c = 0;
  _block = vdd->rootent;
  vdd_local._4_4_ = location;
  do {
    iVar1 = calculate_directory_descriptors(iso9660,vdd,_block,local_2c);
    _block->dir_block = iVar1;
    vdd->total_dir_block = _block->dir_block + vdd->total_dir_block;
    _block->dir_location = vdd_local._4_4_;
    iVar1 = _block->dir_block + vdd_local._4_4_;
    iVar2 = extra_setup_location(_block,iVar1);
    vdd->total_dir_block = iVar2 + vdd->total_dir_block;
    vdd_local._4_4_ = iVar2 + iVar1;
    if (((_block->subdirs).first == (isoent *)0x0) || (vdd->max_depth <= local_2c + 1)) {
      for (; _block != _block->parent; _block = _block->parent) {
        if (_block->drnext != (isoent *)0x0) {
          _block = _block->drnext;
          break;
        }
        local_2c = local_2c + -1;
      }
    }
    else {
      _block = (_block->subdirs).first;
      local_2c = local_2c + 1;
    }
    if (_block == _block->parent) {
      return;
    }
  } while( true );
}

Assistant:

static void
isoent_setup_directory_location(struct iso9660 *iso9660, int location,
    struct vdd *vdd)
{
	struct isoent *np;
	int depth;

	vdd->total_dir_block = 0;
	depth = 0;
	np = vdd->rootent;
	do {
		int block;

		np->dir_block = calculate_directory_descriptors(
		    iso9660, vdd, np, depth);
		vdd->total_dir_block += np->dir_block;
		np->dir_location = location;
		location += np->dir_block;
		block = extra_setup_location(np, location);
		vdd->total_dir_block += block;
		location += block;

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);
}